

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  uchar *puVar5;
  uint *puVar6;
  uint *bitlen;
  uint *bitlen_00;
  uint *puVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  size_t __size;
  uint result_3;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint result_1;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint result;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  HuffmanTree tree_ll;
  uint *local_110;
  uchar *local_100;
  ulong local_f0;
  uint local_e4;
  size_t local_e0;
  ulong local_d8;
  HuffmanTree local_a8;
  HuffmanTree local_88;
  HuffmanTree local_68;
  uchar **local_40;
  ulong *local_38;
  
  local_100 = *out;
  local_f0 = *outsize;
  uVar1 = insize * 8;
  uVar15 = 0;
  uVar16 = 0;
  bVar25 = false;
  local_d8 = local_f0;
  local_40 = out;
  local_38 = outsize;
LAB_00114253:
  if (bVar25) {
    local_e4 = 0;
    goto LAB_00114f6d;
  }
  uVar21 = uVar15 + 2;
  local_e4 = 0x34;
  if (uVar1 <= uVar21) goto LAB_00114f6d;
  bVar25 = (in[uVar15 >> 3] >> ((uint)uVar15 & 7) & 1) != 0;
  uVar24 = uVar15 + 3;
  bVar4 = (in[uVar21 >> 3] >> ((byte)uVar21 & 7)) * '\x02' & 2 |
          (in[uVar15 + 1 >> 3] >> ((uint)(uVar15 + 1) & 7) & 1) != 0;
  if (bVar4 == 0) {
    uVar22 = (ulong)((uint)uVar24 & 7);
    uVar21 = uVar15 + 4 + (uVar22 ^ 7);
    if (uVar22 == 0) {
      uVar21 = uVar24;
    }
    uVar21 = uVar21 >> 3;
    uVar15 = uVar21 + 4;
    if (insize <= uVar15) goto LAB_00114f6d;
    uVar2 = *(ushort *)(in + uVar21);
    uVar17 = (uint)uVar2;
    uVar10 = (uint)uVar2;
    if (*(ushort *)(in + uVar21 + 2) + uVar10 == 0xffff) {
      uVar21 = uVar10 + uVar16;
      puVar5 = local_100;
      if (local_d8 < uVar21) {
        uVar24 = local_d8 * 2;
        local_d8 = uVar21 * 3 >> 1;
        if (uVar24 < uVar21) {
          local_d8 = uVar21;
        }
        puVar5 = (uchar *)realloc(local_100,local_d8);
        if (puVar5 == (uchar *)0x0) {
          local_e4 = 0x53;
          goto LAB_00114f6d;
        }
      }
      local_100 = puVar5;
      local_f0 = uVar21;
      if (uVar10 + uVar15 <= insize) {
        if (uVar2 != 0) {
          do {
            puVar5 = in + uVar15;
            uVar15 = uVar15 + 1;
            local_100[uVar16] = *puVar5;
            uVar16 = uVar16 + 1;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
        }
        uVar15 = uVar15 << 3;
        local_e4 = 0;
        goto LAB_001148ab;
      }
      local_e4 = 0x17;
      goto LAB_00114f6d;
    }
    local_e4 = 0x15;
  }
  else {
    if (bVar4 != 3) {
      local_88.tree2d = (uint *)0x0;
      local_88.tree1d = (uint *)0x0;
      local_88.lengths = (uint *)0x0;
      local_a8.tree2d = (uint *)0x0;
      local_a8.tree1d = (uint *)0x0;
      local_a8.lengths = (uint *)0x0;
      if (bVar4 != 2) {
        if (bVar4 == 1) {
          generateFixedLitLenTree(&local_88);
          generateFixedDistanceTree(&local_a8);
          uVar10 = local_88.numcodes;
          puVar6 = local_88.tree2d;
          uVar17 = local_a8.numcodes;
          local_110 = local_a8.tree2d;
        }
        else {
          local_110 = (uint *)0x0;
          uVar10 = local_88.numcodes;
          puVar6 = local_88.tree2d;
          uVar17 = local_a8.numcodes;
        }
        goto LAB_0011452c;
      }
      uVar21 = uVar15 + 0x11;
      local_e4 = 0x31;
      if (uVar1 < uVar21) {
LAB_001144fe:
        uVar21 = uVar24;
        local_110 = (uint *)0x0;
        puVar6 = (uint *)0x0;
      }
      else {
        iVar8 = 0;
        iVar20 = 0;
        do {
          iVar14 = iVar20;
          iVar13 = (uint)((in[uVar24 >> 3] >> ((uint)uVar24 & 7) & 1) != 0) << ((byte)iVar8 & 0x1f);
          iVar20 = iVar13 + iVar14;
          uVar24 = uVar24 + 1;
          iVar8 = iVar8 + 1;
        } while (iVar8 != 5);
        uVar24 = uVar15 + 8;
        iVar8 = 0;
        iVar23 = 0;
        do {
          iVar23 = iVar23 + ((uint)((in[uVar24 >> 3] >> ((uint)uVar24 & 7) & 1) != 0) <<
                            ((byte)iVar8 & 0x1f));
          uVar24 = uVar24 + 1;
          iVar8 = iVar8 + 1;
        } while (iVar8 != 5);
        uVar15 = uVar15 + 0xd;
        iVar8 = 0;
        iVar19 = 0;
        do {
          iVar19 = iVar19 + ((uint)((in[uVar15 >> 3] >> ((uint)uVar15 & 7) & 1) != 0) <<
                            ((byte)iVar8 & 0x1f));
          uVar15 = uVar15 + 1;
          iVar8 = iVar8 + 1;
        } while (iVar8 != 4);
        if (uVar1 < (iVar19 + 4U) * 3 + uVar21) {
          local_e4 = 0x32;
          uVar24 = uVar21;
          goto LAB_001144fe;
        }
        local_68.tree2d = (uint *)0x0;
        local_68.tree1d = (uint *)0x0;
        local_68.lengths = (uint *)0x0;
        puVar6 = (uint *)malloc(0x4c);
        if (puVar6 == (uint *)0x0) {
          local_110 = (uint *)0x0;
          bitlen = (uint *)0x0;
          bitlen_00 = (uint *)0x0;
          local_e4 = 0x53;
        }
        else {
          uVar10 = iVar20 + 0x101;
          uVar15 = 0;
          do {
            uVar17 = 0;
            if (uVar15 < iVar19 + 4U) {
              iVar8 = 0;
              uVar17 = 0;
              uVar24 = uVar21;
              do {
                uVar17 = uVar17 + ((uint)((in[uVar24 >> 3] >> ((uint)uVar24 & 7) & 1) != 0) <<
                                  ((byte)iVar8 & 0x1f));
                uVar24 = uVar24 + 1;
                iVar8 = iVar8 + 1;
              } while (iVar8 != 3);
              uVar21 = uVar21 + 3;
            }
            puVar6[CLCL_ORDER[uVar15]] = uVar17;
            uVar15 = uVar15 + 1;
          } while (uVar15 != 0x13);
          local_e4 = HuffmanTree_makeFromLengths(&local_68,puVar6,0x13,7);
          if (local_e4 == 0) {
            bitlen = (uint *)malloc(0x480);
            bitlen_00 = (uint *)malloc(0x80);
            if (bitlen_00 == (uint *)0x0 || bitlen == (uint *)0x0) {
              local_110 = (uint *)0x0;
              local_e4 = 0x53;
            }
            else {
              memset(bitlen,0,0x480);
              bitlen_00[0] = 0;
              bitlen_00[1] = 0;
              bitlen_00[2] = 0;
              bitlen_00[3] = 0;
              bitlen_00[4] = 0;
              bitlen_00[5] = 0;
              bitlen_00[6] = 0;
              bitlen_00[7] = 0;
              bitlen_00[8] = 0;
              bitlen_00[9] = 0;
              bitlen_00[10] = 0;
              bitlen_00[0xb] = 0;
              bitlen_00[0xc] = 0;
              bitlen_00[0xd] = 0;
              bitlen_00[0xe] = 0;
              bitlen_00[0xf] = 0;
              bitlen_00[0x10] = 0;
              bitlen_00[0x11] = 0;
              bitlen_00[0x12] = 0;
              bitlen_00[0x13] = 0;
              bitlen_00[0x14] = 0;
              bitlen_00[0x15] = 0;
              bitlen_00[0x16] = 0;
              bitlen_00[0x17] = 0;
              bitlen_00[0x18] = 0;
              bitlen_00[0x19] = 0;
              bitlen_00[0x1a] = 0;
              bitlen_00[0x1b] = 0;
              bitlen_00[0x1c] = 0;
              bitlen_00[0x1d] = 0;
              bitlen_00[0x1e] = 0;
              bitlen_00[0x1f] = 0;
              uVar17 = iVar23 + iVar20 + 0x102U;
              if (uVar17 == 0) {
                local_e4 = 0x40;
LAB_00114ded:
                local_110 = (uint *)0x0;
              }
              else {
                uVar15 = (ulong)uVar10;
                uVar24 = (ulong)uVar17;
                iVar8 = -0x101 - (iVar13 + iVar14);
                local_e4 = 0;
                uVar9 = 0;
                do {
                  uVar11 = 0;
                  uVar22 = uVar21;
LAB_00114a9a:
                  if (uVar1 <= uVar22) {
                    uVar22 = uVar21;
                    if (uVar21 <= uVar1) {
                      uVar22 = uVar1;
                    }
                    goto LAB_00114dd7;
                  }
                  uVar3 = local_68.tree2d
                          [(uint)((in[uVar22 >> 3] >> ((uint)uVar22 & 7) & 1) != 0) + uVar11 * 2];
                  uVar11 = uVar3 - local_68.numcodes;
                  if (local_68.numcodes <= uVar3) goto code_r0x00114acf;
                  uVar18 = uVar22 + 1;
                  if (uVar3 < 0x10) {
                    puVar12 = bitlen_00;
                    uVar11 = uVar10;
                    if (uVar9 < uVar10) {
                      puVar12 = bitlen;
                      uVar11 = 0;
                    }
                    puVar12[uVar9 - uVar11] = uVar3;
                    uVar9 = uVar9 + 1;
                    uVar21 = uVar18;
                  }
                  else if (uVar3 == 0x12) {
                    if (uVar1 < uVar22 + 8) {
LAB_00114ea4:
                      local_e4 = 0x32;
                      goto LAB_00114ee9;
                    }
                    uVar21 = uVar22 + 8;
                    iVar13 = 0;
                    iVar14 = 0;
                    do {
                      iVar14 = iVar14 + ((uint)((in[uVar18 >> 3] >> ((uint)uVar18 & 7) & 1) != 0) <<
                                        ((byte)iVar13 & 0x1f));
                      uVar18 = uVar18 + 1;
                      iVar13 = iVar13 + 1;
                    } while (iVar13 != 7);
                    iVar14 = iVar14 + 0xb;
                    if (iVar14 != 0) {
                      uVar22 = (ulong)uVar9;
                      iVar13 = -uVar9;
                      puVar12 = bitlen + uVar22;
                      do {
                        if (uVar24 <= uVar22) {
                          uVar9 = -iVar13;
                          local_e4 = 0xf;
                          goto LAB_00114d3f;
                        }
                        puVar7 = bitlen_00 + (uint)(iVar8 + (int)uVar22);
                        if (uVar22 < uVar15) {
                          puVar7 = puVar12;
                        }
                        *puVar7 = 0;
                        uVar22 = uVar22 + 1;
                        iVar13 = iVar13 + -1;
                        puVar12 = puVar12 + 1;
                        iVar14 = iVar14 + -1;
                      } while (iVar14 != 0);
LAB_00114d15:
                      uVar9 = -iVar13;
                    }
                  }
                  else {
                    if (uVar3 != 0x11) {
                      if (uVar3 == 0x10) {
                        if (uVar9 != 0) {
                          if (uVar22 + 3 <= uVar1) {
                            uVar21 = uVar22 + 3;
                            iVar13 = 0;
                            iVar14 = 0;
                            do {
                              iVar14 = iVar14 + ((uint)((in[uVar18 >> 3] >> ((uint)uVar18 & 7) & 1)
                                                       != 0) << ((byte)iVar13 & 0x1f));
                              uVar18 = uVar18 + 1;
                              iVar13 = iVar13 + 1;
                            } while (iVar13 != 2);
                            puVar12 = bitlen_00 + ((uVar9 - iVar20) - 0x102);
                            if (uVar9 < iVar20 + 0x102U) {
                              puVar12 = bitlen + (uVar9 - 1);
                            }
                            iVar14 = iVar14 + 3;
                            if (iVar14 != 0) {
                              uVar11 = *puVar12;
                              uVar22 = (ulong)uVar9;
                              iVar13 = -uVar9;
                              puVar12 = bitlen + uVar22;
                              do {
                                if (uVar24 <= uVar22) {
                                  uVar9 = -iVar13;
                                  local_e4 = 0xd;
                                  goto LAB_00114d3f;
                                }
                                puVar7 = bitlen_00 + (uint)(iVar8 + (int)uVar22);
                                if (uVar22 < uVar15) {
                                  puVar7 = puVar12;
                                }
                                *puVar7 = uVar11;
                                uVar22 = uVar22 + 1;
                                iVar13 = iVar13 + -1;
                                puVar12 = puVar12 + 1;
                                iVar14 = iVar14 + -1;
                              } while (iVar14 != 0);
                              goto LAB_00114d15;
                            }
                            goto LAB_00114d3f;
                          }
                          goto LAB_00114ea4;
                        }
                        local_e4 = 0x36;
                      }
                      else {
                        local_e4 = 0x10;
                      }
LAB_00114ee9:
                      uVar21 = uVar22 + 1;
                      local_110 = (uint *)0x0;
                      goto LAB_00114dfa;
                    }
                    if (uVar1 < uVar22 + 4) goto LAB_00114ea4;
                    uVar21 = uVar22 + 4;
                    iVar13 = 0;
                    iVar14 = 0;
                    do {
                      iVar14 = iVar14 + ((uint)((in[uVar18 >> 3] >> ((uint)uVar18 & 7) & 1) != 0) <<
                                        ((byte)iVar13 & 0x1f));
                      uVar18 = uVar18 + 1;
                      iVar13 = iVar13 + 1;
                    } while (iVar13 != 3);
                    iVar14 = iVar14 + 3;
                    if (iVar14 != 0) {
                      uVar22 = (ulong)uVar9;
                      iVar13 = -uVar9;
                      puVar12 = bitlen + uVar22;
                      do {
                        if (uVar24 <= uVar22) {
                          uVar9 = -iVar13;
                          local_e4 = 0xe;
                          goto LAB_00114d3f;
                        }
                        puVar7 = bitlen_00 + (uint)(iVar8 + (int)uVar22);
                        if (uVar22 < uVar15) {
                          puVar7 = puVar12;
                        }
                        *puVar7 = 0;
                        uVar22 = uVar22 + 1;
                        iVar13 = iVar13 + -1;
                        puVar12 = puVar12 + 1;
                        iVar14 = iVar14 + -1;
                      } while (iVar14 != 0);
                      goto LAB_00114d15;
                    }
                  }
LAB_00114d3f:
                } while (uVar9 < uVar17);
                if (local_e4 == 0) {
                  if (bitlen[0x100] == 0) {
                    local_110 = (uint *)0x0;
                    local_e4 = 0x40;
                  }
                  else {
                    local_e4 = HuffmanTree_makeFromLengths(&local_88,bitlen,0x120,0xf);
                    if (local_e4 != 0) goto LAB_00114d63;
                    local_e4 = HuffmanTree_makeFromLengths(&local_a8,bitlen_00,0x20,0xf);
                    local_110 = local_a8.tree2d;
                  }
                }
                else {
LAB_00114d63:
                  local_110 = (uint *)0x0;
                }
              }
            }
          }
          else {
            local_110 = (uint *)0x0;
            bitlen = (uint *)0x0;
            bitlen_00 = (uint *)0x0;
          }
        }
LAB_00114dfa:
        free(puVar6);
        free(bitlen);
        free(bitlen_00);
        free(local_68.tree2d);
        free(local_68.tree1d);
        free(local_68.lengths);
        puVar6 = local_88.tree2d;
        uVar24 = uVar21;
        uVar10 = local_88.numcodes;
        uVar17 = local_a8.numcodes;
        if (local_e4 == 0) {
LAB_0011452c:
          while( true ) {
            uVar9 = 0;
            uVar21 = uVar24;
            while( true ) {
              uVar15 = uVar21;
              if (uVar1 <= uVar15) {
                uVar21 = uVar24;
                if (uVar24 <= uVar1) {
                  uVar21 = uVar1;
                }
                goto LAB_0011483c;
              }
              uVar11 = puVar6[(uint)((in[uVar15 >> 3] >> ((uint)uVar15 & 7) & 1) != 0) + uVar9 * 2];
              uVar21 = uVar15 + 1;
              uVar9 = uVar11 - uVar10;
              if (uVar11 < uVar10) break;
              if (uVar10 <= uVar9) {
                uVar21 = uVar15 + 1;
                goto LAB_0011483c;
              }
            }
            uVar24 = uVar15 + 1;
            if (uVar11 < 0x100) break;
            if ((uVar11 == 0x100) || (0x11d < uVar11)) {
              uVar21 = uVar15 + 1;
              local_e4 = 0;
              if (uVar11 != 0x100) {
LAB_0011483c:
                local_e4 = 0xb - (uVar1 < uVar21);
              }
              goto LAB_0011484c;
            }
            uVar21 = (ulong)(uVar11 - 0x101);
            if (uVar1 < LENGTHEXTRA[uVar21] + uVar15 + 1) {
              uVar21 = uVar15 + 1;
              local_e4 = 0x33;
              goto LAB_0011484c;
            }
            if (uVar21 - 0x1c < 0xffffffffffffffec) {
              uVar15 = 0;
            }
            else {
              uVar11 = 0;
              uVar9 = 0;
              do {
                uVar9 = uVar9 + ((uint)((in[uVar24 >> 3] >> ((uint)uVar24 & 7) & 1) != 0) <<
                                ((byte)uVar11 & 0x1f));
                uVar24 = uVar24 + 1;
                uVar11 = uVar11 + 1;
              } while (LENGTHEXTRA[uVar21] != uVar11);
              uVar15 = (ulong)uVar9;
            }
            uVar15 = LENGTHBASE[uVar21] + uVar15;
            uVar22 = uVar1;
            if (uVar1 < uVar24) {
              uVar22 = uVar24;
            }
            uVar9 = 0;
LAB_0011469c:
            uVar21 = uVar22;
            if (uVar22 == uVar24) goto LAB_0011499c;
            uVar9 = local_110[(uint)((in[uVar24 >> 3] >> ((uint)uVar24 & 7) & 1) != 0) + uVar9 * 2];
            uVar21 = uVar24 + 1;
            if (uVar17 <= uVar9) goto code_r0x001146d3;
            if (0x1d < uVar9) {
              local_e4 = 0x12;
              goto LAB_0011484c;
            }
            if (uVar1 < DISTANCEEXTRA[uVar9] + uVar24 + 1) {
              uVar21 = uVar24 + 1;
              local_e4 = 0x33;
              goto LAB_0011484c;
            }
            uVar21 = uVar24 + 1;
            iVar20 = 0;
            if (3 < uVar9) {
              uVar11 = 0;
              iVar20 = 0;
              do {
                iVar20 = iVar20 + ((uint)((in[uVar21 >> 3] >> ((uint)uVar21 & 7) & 1) != 0) <<
                                  ((byte)uVar11 & 0x1f));
                uVar21 = uVar21 + 1;
                uVar11 = uVar11 + 1;
              } while (DISTANCEEXTRA[uVar9] != uVar11);
            }
            uVar24 = (ulong)(iVar20 + DISTANCEBASE[uVar9]);
            if (uVar16 < uVar24) {
              local_e4 = 0x34;
              goto LAB_0011484c;
            }
            uVar22 = uVar15 + uVar16;
            if (local_d8 < uVar22) {
              local_e0 = uVar22 * 3 >> 1;
              if (local_d8 * 2 < uVar22) {
                local_e0 = uVar22;
              }
              puVar5 = (uchar *)realloc(local_100,local_e0);
              if (puVar5 == (uchar *)0x0) {
                local_e4 = 0x53;
                goto LAB_0011484c;
              }
            }
            else {
              local_e0 = local_d8;
              puVar5 = local_100;
            }
            local_100 = puVar5;
            if (uVar24 < uVar15) {
              do {
                local_100[uVar16] = local_100[uVar16 - uVar24];
                uVar16 = uVar16 + 1;
                uVar15 = uVar15 - 1;
              } while (uVar15 != 0);
            }
            else {
              memcpy(local_100 + uVar16,local_100 + (uVar16 - uVar24),uVar15);
              uVar16 = uVar22;
            }
            local_d8 = local_e0;
            uVar24 = uVar21;
            local_f0 = uVar22;
          }
          uVar15 = uVar16 + 1;
          __size = local_d8;
          puVar5 = local_100;
          if (local_d8 < uVar15) {
            __size = uVar15 * 3 >> 1;
            if (local_d8 * 2 < uVar15) {
              __size = uVar15;
            }
            puVar5 = (uchar *)realloc(local_100,__size);
            if (puVar5 == (uchar *)0x0) goto LAB_00114e5e;
          }
          local_100 = puVar5;
          local_100[uVar16] = (uchar)uVar11;
          uVar16 = uVar15;
          local_f0 = uVar15;
          local_d8 = __size;
          goto LAB_0011452c;
        }
      }
      goto LAB_0011484c;
    }
    local_e4 = 0x14;
  }
  goto LAB_00114f6d;
code_r0x00114acf:
  uVar22 = uVar22 + 1;
  if (local_68.numcodes <= uVar11) {
LAB_00114dd7:
    local_e4 = 0xb - (uVar1 < uVar22);
    uVar21 = uVar22;
    goto LAB_00114ded;
  }
  goto LAB_00114a9a;
code_r0x001146d3:
  uVar9 = uVar9 - uVar17;
  uVar24 = uVar21;
  if (uVar17 <= uVar9) {
LAB_0011499c:
    local_e4 = 0xb - (uVar1 < uVar21);
    goto LAB_0011484c;
  }
  goto LAB_0011469c;
LAB_00114e5e:
  local_e4 = 0x53;
LAB_0011484c:
  free(puVar6);
  free(local_88.tree1d);
  free(local_88.lengths);
  free(local_110);
  free(local_a8.tree1d);
  free(local_a8.lengths);
  uVar15 = uVar21;
LAB_001148ab:
  if (local_e4 != 0) {
LAB_00114f6d:
    *local_40 = local_100;
    *local_38 = local_f0;
    return local_e4;
  }
  goto LAB_00114253;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}